

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O2

int OpenMD::LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>
              (SquareMatrix<double,_6> *A,int *index,int size,ElemPoinerType tmpSize)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  double (*padVar8) [6];
  ulong uVar9;
  double (*padVar10) [6];
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  double (*padVar15) [6];
  ulong uVar16;
  double (*padVar17) [6];
  double *pdVar18;
  double dVar19;
  double dVar20;
  
  uVar2 = 0;
  uVar16 = 0;
  if (0 < size) {
    uVar16 = (ulong)(uint)size;
  }
  uVar11 = (ulong)(uint)size;
  padVar8 = (double (*) [6])A;
  for (; uVar2 != uVar16; uVar2 = uVar2 + 1) {
    dVar19 = 0.0;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      dVar20 = ABS(((RectMatrix<double,_6U,_6U> *)*padVar8)->data_[0][uVar9]);
      if (dVar20 <= dVar19) {
        dVar20 = dVar19;
      }
      dVar19 = dVar20;
    }
    if ((dVar19 == 0.0) && (!NAN(dVar19))) goto LAB_00223495;
    tmpSize[uVar2] = 1.0 / dVar19;
    padVar8 = padVar8 + 1;
  }
  padVar8 = (A->super_RectMatrix<double,_6U,_6U>).data_ + 1;
  lVar3 = 0;
  iVar4 = 1;
  uVar2 = 0;
  uVar9 = 0;
  padVar10 = (double (*) [6])A;
  pdVar12 = (double *)A;
  while( true ) {
    if (uVar2 == uVar16) {
      return 1;
    }
    padVar15 = (double (*) [6])A;
    for (uVar13 = 0; uVar13 != uVar2; uVar13 = uVar13 + 1) {
      pdVar14 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar13] + uVar2;
      dVar19 = *pdVar14;
      padVar17 = padVar10;
      for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        dVar19 = dVar19 - ((RectMatrix<double,_6U,_6U> *)*padVar15)->data_[0][uVar5] *
                          ((RectMatrix<double,_6U,_6U> *)*padVar17)->data_[0][0];
        padVar17 = padVar17 + 1;
      }
      *pdVar14 = dVar19;
      padVar15 = padVar15 + 1;
    }
    dVar19 = 0.0;
    pdVar14 = pdVar12;
    for (uVar13 = uVar2; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      pdVar1 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar13] + uVar2;
      dVar20 = *pdVar1;
      pdVar18 = pdVar14;
      for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 6) {
        dVar20 = dVar20 - *pdVar18 * (*padVar10)[lVar6];
        pdVar18 = pdVar18 + 1;
      }
      *pdVar1 = dVar20;
      dVar20 = ABS(dVar20) * tmpSize[uVar13];
      if (dVar19 <= dVar20) {
        uVar9 = uVar13 & 0xffffffff;
      }
      dVar19 = (double)(-(ulong)(dVar20 < dVar19) & (ulong)dVar19 |
                       ~-(ulong)(dVar20 < dVar19) & (ulong)dVar20);
      pdVar14 = pdVar14 + 6;
    }
    if (uVar2 != uVar9) {
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        dVar19 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar9][uVar13];
        (A->super_RectMatrix<double,_6U,_6U>).data_[uVar9][uVar13] = pdVar12[uVar13];
        pdVar12[uVar13] = dVar19;
      }
      tmpSize[(int)uVar9] = tmpSize[uVar2];
    }
    index[uVar2] = (int)uVar9;
    dVar19 = *(double *)((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar2 * 0x38);
    if (ABS(dVar19) <= 1e-12) break;
    if (uVar2 != size - 1) {
      padVar15 = padVar8;
      for (iVar7 = iVar4; iVar7 < size; iVar7 = iVar7 + 1) {
        (*padVar15)[0] = (*padVar15)[0] * (1.0 / dVar19);
        padVar15 = padVar15 + 1;
      }
    }
    uVar2 = uVar2 + 1;
    padVar10 = (double (*) [6])(*padVar10 + 1);
    lVar3 = lVar3 + 6;
    pdVar12 = pdVar12 + 6;
    padVar8 = (double (*) [6])(padVar8[1] + 1);
    iVar4 = iVar4 + 1;
  }
LAB_00223495:
  std::operator<<((ostream *)&std::cerr,"Unable to factor linear system");
  return 0;
}

Assistant:

int LUFactorLinearSystem(MatrixType& A, int* index, int size,
                           typename MatrixType::ElemPoinerType tmpSize) {
    using Real = typename MatrixType::ElemType;

    int i, j, k;
    int maxI = 0;
    Real largest, temp1, temp2, sum;

    //
    // Loop over rows to get implicit scaling information
    //
    for (i = 0; i < size; ++i) {
      for (largest = 0.0, j = 0; j < size; ++j) {
        if ((temp2 = std::abs(A(i, j))) > largest) { largest = temp2; }
      }

      if (largest == 0.0) {
        std::cerr << "Unable to factor linear system";
        return 0;
      }
      tmpSize[i] = 1.0 / largest;
    }
    //
    // Loop over all columns using Crout's method
    //
    for (j = 0; j < size; ++j) {
      for (i = 0; i < j; ++i) {
        sum = A(i, j);
        for (k = 0; k < i; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;
      }
      //
      // Begin search for largest pivot element
      //
      for (largest = 0.0, i = j; i < size; ++i) {
        sum = A(i, j);
        for (k = 0; k < j; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;

        if ((temp1 = tmpSize[i] * std::abs(sum)) >= largest) {
          largest = temp1;
          maxI    = i;
        }
      }
      //
      // Check for row interchange
      //
      if (j != maxI) {
        for (k = 0; k < size; ++k) {
          std::swap(A(maxI, k), A(j, k));
        }
        tmpSize[maxI] = tmpSize[j];
      }
      //
      // Divide by pivot element and perform elimination
      //
      index[j] = maxI;

      if (std::abs(A(j, j)) <= SMALL_NUMBER) {
        std::cerr << "Unable to factor linear system";
        return false;
      }

      if (j != (size - 1)) {
        temp1 = 1.0 / A(j, j);
        for (i = j + 1; i < size; ++i) {
          A(i, j) *= temp1;
        }
      }
    }

    return 1;
  }